

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O3

Status __thiscall spvtools::opt::PrivateToLocalPass::Process(PrivateToLocalPass *this)

{
  IRContext *this_00;
  Module *pMVar1;
  _Hash_node_base *p_Var2;
  pointer pOVar3;
  iterator iVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  const_iterator __cbeg;
  Function *pFVar8;
  Operand *__x;
  ulong uVar9;
  iterator __end2;
  uint uVar10;
  FeatureManager *pFVar11;
  uint uVar12;
  Instruction *pIVar13;
  Instruction *inst;
  Instruction *pIVar14;
  Status SVar15;
  pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *ppVar16;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> new_operands;
  vector<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*>_>_>
  variables_to_move;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  localized_variables;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_b8;
  pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *local_98;
  uint32_t local_8c;
  pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *local_88;
  iterator iStack_80;
  pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *local_78;
  undefined1 local_68 [40];
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  this_00 = (this->super_Pass).context_;
  pFVar11 = (this_00->feature_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
            .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar11 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(this_00);
    pFVar11 = (this_00->feature_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
              .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  bVar5 = EnumSet<spv::Capability>::contains(&pFVar11->capabilities_,Addresses);
  SVar15 = SuccessWithoutChange;
  if (!bVar5) {
    local_88 = (pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *)0x0;
    iStack_80._M_current = (pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *)0x0;
    local_78 = (pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *)0x0;
    local_68._0_8_ = &p_Stack_38;
    local_68._8_8_ = (Instruction *)0x1;
    local_68._16_8_ = (Instruction *)0x0;
    local_68._24_8_ = 0;
    local_68._32_4_ = 1.0;
    local_40 = 0;
    p_Stack_38 = (__node_base_ptr)0x0;
    pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    pIVar14 = *(Instruction **)
               ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> +
               0x10);
    pIVar13 = (Instruction *)
              ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
    if (pIVar14 != pIVar13) {
      do {
        if (pIVar14->opcode_ == OpVariable) {
          uVar6 = (pIVar14->has_result_id_ & 1) + 1;
          if (pIVar14->has_type_id_ == false) {
            uVar6 = (uint)pIVar14->has_result_id_;
          }
          uVar6 = Instruction::GetSingleWordOperand(pIVar14,uVar6);
          if ((uVar6 == 6) && (pFVar8 = FindLocalFunction(this,pIVar14), pFVar8 != (Function *)0x0))
          {
            local_b8.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)pIVar14;
            local_b8.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)pFVar8;
            if (iStack_80._M_current == local_78) {
              std::
              vector<std::pair<spvtools::opt::Instruction*,spvtools::opt::Function*>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Function*>>>
              ::_M_realloc_insert<std::pair<spvtools::opt::Instruction*,spvtools::opt::Function*>>
                        ((vector<std::pair<spvtools::opt::Instruction*,spvtools::opt::Function*>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Function*>>>
                          *)&local_88,iStack_80,
                         (pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *)&local_b8)
              ;
            }
            else {
              local_b8.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pIVar14,0);
              local_b8.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)pIVar14 >> 0x20);
              local_b8.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pFVar8,0);
              local_b8.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pFVar8 >> 0x20);
              *(undefined4 *)&(iStack_80._M_current)->first =
                   local_b8.
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_;
              *(undefined4 *)((long)&(iStack_80._M_current)->first + 4) =
                   local_b8.
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_;
              *(undefined4 *)&(iStack_80._M_current)->second =
                   local_b8.
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_finish._0_4_;
              *(undefined4 *)((long)&(iStack_80._M_current)->second + 4) =
                   local_b8.
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_4_;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
          }
        }
        iVar4._M_current = iStack_80._M_current;
        pIVar14 = (pIVar14->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      } while (pIVar14 != pIVar13);
      SVar15 = SuccessWithoutChange;
      if (local_88 != iStack_80._M_current) {
        local_98 = local_88;
        ppVar16 = local_88;
        do {
          pIVar14 = ppVar16->first;
          bVar5 = MoveVariable(this,pIVar14,ppVar16->second);
          if (!bVar5) {
            SVar15 = Failure;
            goto LAB_0052952e;
          }
          uVar6 = 0;
          if (pIVar14->has_result_id_ == true) {
            uVar6 = Instruction::GetSingleWordOperand(pIVar14,(uint)pIVar14->has_type_id_);
          }
          local_b8.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_68;
          local_8c = uVar6;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_68,&local_8c,&local_b8);
          ppVar16 = ppVar16 + 1;
        } while (ppVar16 != iVar4._M_current);
        SVar15 = local_98 == iVar4._M_current | SuccessWithChange;
      }
    }
    pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    if (0x103ff < (pMVar1->header_).version) {
      pIVar14 = *(Instruction **)
                 ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> +
                 0x10);
      pIVar13 = (Instruction *)
                ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8)
      ;
      if (pIVar14 != pIVar13) {
        local_98 = (pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *)
                   CONCAT44(local_98._4_4_,SVar15);
        do {
          local_b8.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b8.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uVar10 = (pIVar14->has_result_id_ & 1) + 1;
          if (pIVar14->has_type_id_ == false) {
            uVar10 = (uint)pIVar14->has_result_id_;
          }
          if (uVar10 != (int)((ulong)((long)(pIVar14->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pIVar14->operands_).
                                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                        -0x55555555) {
            uVar6 = 0;
            do {
              if (2 < uVar6) {
                uVar7 = Instruction::GetSingleWordOperand(pIVar14,uVar10 + uVar6);
                if (*(__node_base_ptr *)
                     (local_68._0_8_ + ((ulong)uVar7 % (ulong)local_68._8_8_) * 8) !=
                    (__node_base_ptr)0x0) {
                  p_Var2 = (*(__node_base_ptr *)
                             (local_68._0_8_ + ((ulong)uVar7 % (ulong)local_68._8_8_) * 8))->_M_nxt;
                  uVar10 = *(uint *)&p_Var2[1]._M_nxt;
                  do {
                    if (uVar7 == uVar10) goto LAB_00529469;
                    p_Var2 = p_Var2->_M_nxt;
                  } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                          (uVar10 = *(uint *)&p_Var2[1]._M_nxt,
                          (ulong)uVar10 % (ulong)local_68._8_8_ ==
                          (ulong)uVar7 % (ulong)local_68._8_8_));
                }
              }
              __x = Instruction::GetInOperand(pIVar14,uVar6);
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
              push_back(&local_b8,__x);
LAB_00529469:
              uVar6 = uVar6 + 1;
              pOVar3 = (pIVar14->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar9 = (long)(pIVar14->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3;
              bVar5 = pIVar14->has_result_id_;
              uVar10 = (bVar5 & 1) + 1;
              if (pIVar14->has_type_id_ == false) {
                uVar10 = (uint)bVar5;
              }
              uVar12 = (int)(uVar9 >> 4) * -0x55555555 - uVar10;
            } while (uVar6 < uVar12);
            if (((long)local_b8.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_b8.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 -
                (ulong)uVar12 != 0) {
              uVar10 = (bVar5 & 1) + 1;
              if (pIVar14->has_type_id_ == false) {
                uVar10 = (uint)bVar5;
              }
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                        (&pIVar14->operands_,
                         (Operand *)
                         ((long)((pOVar3->words).buffer + 0xfffffffffffffffa) +
                         (ulong)(uVar10 * 0x30)),(Operand *)(uVar9 + (long)pOVar3));
              std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                        ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                         &pIVar14->operands_,
                         (pIVar14->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         local_b8.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_b8.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              IRContext::AnalyzeUses((this->super_Pass).context_,pIVar14);
            }
          }
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    (&local_b8);
          pIVar14 = (pIVar14->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        } while (pIVar14 != pIVar13);
        SVar15 = (Status)local_98;
      }
    }
LAB_0052952e:
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_68);
    if (local_88 != (pair<spvtools::opt::Instruction_*,_spvtools::opt::Function_*> *)0x0) {
      operator_delete(local_88,(long)local_78 - (long)local_88);
    }
  }
  return SVar15;
}

Assistant:

Pass::Status PrivateToLocalPass::Process() {
  bool modified = false;

  // Private variables require the shader capability.  If this is not a shader,
  // there is no work to do.
  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Addresses))
    return Status::SuccessWithoutChange;

  std::vector<std::pair<Instruction*, Function*>> variables_to_move;
  std::unordered_set<uint32_t> localized_variables;
  for (auto& inst : context()->types_values()) {
    if (inst.opcode() != spv::Op::OpVariable) {
      continue;
    }

    if (spv::StorageClass(inst.GetSingleWordInOperand(
            kVariableStorageClassInIdx)) != spv::StorageClass::Private) {
      continue;
    }

    Function* target_function = FindLocalFunction(inst);
    if (target_function != nullptr) {
      variables_to_move.push_back({&inst, target_function});
    }
  }

  modified = !variables_to_move.empty();
  for (auto p : variables_to_move) {
    if (!MoveVariable(p.first, p.second)) {
      return Status::Failure;
    }
    localized_variables.insert(p.first->result_id());
  }

  if (get_module()->version() >= SPV_SPIRV_VERSION_WORD(1, 4)) {
    // In SPIR-V 1.4 and later entry points must list private storage class
    // variables that are statically used by the entry point. Go through the
    // entry points and remove any references to variables that were localized.
    for (auto& entry : get_module()->entry_points()) {
      std::vector<Operand> new_operands;
      for (uint32_t i = 0; i < entry.NumInOperands(); ++i) {
        // Execution model, function id and name are always kept.
        if (i < 3 ||
            !localized_variables.count(entry.GetSingleWordInOperand(i))) {
          new_operands.push_back(entry.GetInOperand(i));
        }
      }
      if (new_operands.size() != entry.NumInOperands()) {
        entry.SetInOperands(std::move(new_operands));
        context()->AnalyzeUses(&entry);
      }
    }
  }

  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}